

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_from_curvature(REF_DBL *metric,REF_GRID ref_grid)

{
  REF_DBL *pRVar1;
  double dVar2;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_INT *pRVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  long lVar7;
  REF_DBL *m;
  ulong uVar8;
  char *pcVar9;
  REF_INT RVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  REF_DBL hmax;
  REF_DBL slop;
  REF_DBL hr;
  REF_GRID local_1a8;
  double local_1a0;
  long local_198;
  REF_DBL delta_radian;
  double local_188;
  REF_DBL hs;
  REF_DBL *local_178;
  double local_170;
  REF_DBL crease_dot_prod;
  double local_160;
  REF_DBL r [3];
  REF_DBL s [3];
  double local_118;
  double dStack_110;
  double local_108;
  undefined1 local_f8 [16];
  double local_e8;
  REF_DBL local_e0;
  REF_DBL RStack_d8;
  REF_DBL local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  REF_DBL local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  REF_DBL previous_metric [6];
  REF_DBL curvature_metric [6];
  
  ref_node = ref_grid->node;
  ref_geom = ref_grid->geom;
  hmax = 1e+200;
  local_1a8 = ref_grid;
  if (ref_geom->model == (void *)0x0) {
    if (ref_geom->meshlink == (void *)0x0) {
      puts("\nNo geometry model, did you forget to load it?\n");
      pcVar9 = "...or implement non-CAD curvature estimate";
      uVar4 = 6;
      uVar6 = 0x53b;
      uVar8 = 6;
      goto LAB_001c3a0c;
    }
    uVar4 = ref_node_bounding_box_diagonal(ref_node,&hmax);
    if (uVar4 == 0) goto LAB_001c2d0a;
    pcVar9 = "bbox diag";
    uVar6 = 0x538;
  }
  else {
    uVar4 = ref_egads_diagonal(ref_geom,-1,&hmax);
    if (uVar4 == 0) {
LAB_001c2d0a:
      dVar14 = 1.0;
      if (1.0 <= ref_geom->segments_per_bounding_box_diagonal) {
        dVar14 = ref_geom->segments_per_bounding_box_diagonal;
      }
      hmax = hmax / dVar14;
      iVar5 = ref_node->max;
      local_178 = metric;
      if (0 < iVar5) {
        lVar7 = 0;
        do {
          if ((-1 < ref_node->global[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) {
            if (ref_geom->model == (void *)0x0) {
              dVar14 = (1.0 / hmax) / hmax;
              *metric = dVar14;
              metric[1] = 0.0;
              metric[2] = 0.0;
              metric[3] = dVar14;
              metric[4] = 0.0;
              metric[5] = dVar14;
            }
            else {
              uVar4 = ref_egads_feature_size
                                (local_1a8,(REF_INT)lVar7,&hr,r,&hs,s,&local_170,&local_118);
              if (uVar4 != 0) {
                pcVar9 = "feature size";
                uVar6 = 0x54b;
                goto LAB_001c3a09;
              }
              if (hr * 20.0 <= hs) {
                hs = hr * 20.0;
              }
              if (hr + hr <= local_170) {
                local_170 = hr + hr;
              }
              auVar13._8_8_ = hs;
              auVar13._0_8_ = hr;
              if (hs + hs <= local_170) {
                local_170 = hs + hs;
              }
              local_d0 = r[2];
              local_e0 = r[0];
              RStack_d8 = r[1];
              local_b8 = s[2];
              local_c8 = CONCAT44(s[0]._4_4_,s[0]._0_4_);
              uStack_c0 = CONCAT44(s[1]._4_4_,s[1]._0_4_);
              auVar12 = divpd(_DAT_0020f770,auVar13);
              local_f8 = divpd(auVar12,auVar13);
              local_a0 = local_108;
              local_b0 = local_118;
              dStack_a8 = dStack_110;
              local_e8 = (1.0 / local_170) / local_170;
              uVar4 = ref_matrix_form_m((REF_DBL *)local_f8,metric);
              if (uVar4 != 0) {
                pcVar9 = "form m";
                uVar6 = 0x555;
                goto LAB_001c3a09;
              }
              iVar5 = ref_node->max;
            }
          }
          lVar7 = lVar7 + 1;
          metric = metric + 6;
        } while (lVar7 < iVar5);
      }
      if (0 < ref_geom->max) {
        lVar11 = 0;
        lVar7 = 0;
        do {
          pRVar3 = ref_geom->descr;
          if ((*(int *)((long)pRVar3 + lVar11) == 2) &&
             (local_198 = (long)*(int *)((long)pRVar3 + lVar11 + 0x14),
             ref_node->ref_mpi->id == ref_node->part[local_198])) {
            iVar5 = *(int *)((long)pRVar3 + lVar11 + 4);
            RVar10 = (REF_INT)lVar7;
            uVar4 = ref_geom_radian_request(ref_geom,RVar10,&delta_radian);
            if (uVar4 != 0) {
              pcVar9 = "drad";
              uVar6 = 0x565;
              goto LAB_001c3a09;
            }
            if (ref_geom->model == (void *)0x0) {
              if (ref_geom->meshlink == (void *)0x0) goto LAB_001c32a1;
              local_188 = hmax / delta_radian;
              uVar4 = ref_meshlink_face_curvature(local_1a8,RVar10,&local_1a0,r,&local_160,s);
              if (uVar4 != 0) {
                pcVar9 = "curve";
                uVar6 = 0x56c;
                goto LAB_001c3a09;
              }
            }
            else {
              local_188 = hmax / delta_radian;
              uVar4 = ref_egads_face_curvature(ref_geom,RVar10,&local_1a0,r,&local_160,s);
              if (1 < uVar4) {
                pcVar9 = "curve";
                uVar6 = 0x569;
                goto LAB_001c3a09;
              }
            }
            if (local_1a0 <= -local_1a0) {
              local_1a0 = -local_1a0;
            }
            if (local_160 <= -local_160) {
              local_160 = -local_160;
            }
            if (local_1a0 <= local_160 * 0.05) {
              local_1a0 = local_160 * 0.05;
            }
            if (local_160 <= local_1a0 * 0.05) {
              local_160 = local_1a0 * 0.05;
            }
            hr = hmax;
            if (1.0 / local_188 < local_1a0) {
              hr = delta_radian / local_1a0;
            }
            hs = hmax;
            if (1.0 / local_188 < local_160) {
              hs = delta_radian / local_160;
            }
            if (ref_geom->model == (void *)0x0) {
              if (ref_geom->meshlink == (void *)0x0) {
                slop = hmax * 1e-05;
              }
              else {
                uVar4 = ref_meshlink_gap(local_1a8,(REF_INT)local_198,&slop);
                if (uVar4 != 0) {
                  pcVar9 = "edge tol";
                  uVar6 = 0x581;
                  goto LAB_001c3a09;
                }
                slop = ref_geom->gap_protection * slop;
              }
            }
            else {
              uVar4 = ref_geom_usable(ref_geom,RVar10,(REF_BOOL *)&crease_dot_prod);
              if (uVar4 != 0) {
                pcVar9 = "useable curvature";
                uVar6 = 0x57d;
                goto LAB_001c3a09;
              }
              if (crease_dot_prod._0_4_ == 0) goto LAB_001c32a1;
              uVar4 = ref_geom_reliability(ref_geom,RVar10,&slop);
              if (uVar4 != 0) {
                pcVar9 = "edge tol";
                uVar6 = 0x57f;
                goto LAB_001c3a09;
              }
            }
            if ((slop <= hr) && (slop <= hs)) {
              dVar14 = hmax;
              if ((0 < iVar5) && (iVar5 <= ref_geom->nface)) {
                if (((ref_geom->face_min_length != (REF_DBL *)0x0) &&
                    (dVar2 = ref_geom->face_min_length[iVar5 - 1U], 0.0 < dVar2)) &&
                   ((hr < dVar2 || (hs < dVar2)))) goto LAB_001c32a1;
                if ((ref_geom->initial_cell_height != (REF_DBL *)0x0) &&
                   (dVar2 = ref_geom->initial_cell_height[iVar5 - 1U], 0.0 < dVar2)) {
                  dVar14 = dVar2;
                }
              }
              if (hr + hr <= dVar14) {
                dVar14 = hr + hr;
              }
              local_170 = dVar14;
              if (hs + hs <= dVar14) {
                local_170 = hs + hs;
              }
              local_118 = s[2] * r[1] - r[2] * (double)CONCAT44(s[1]._4_4_,s[1]._0_4_);
              dStack_110 = (double)CONCAT44(s[0]._4_4_,s[0]._0_4_) * r[2] - r[0] * s[2];
              local_108 = r[0] * (double)CONCAT44(s[1]._4_4_,s[1]._0_4_) -
                          (double)CONCAT44(s[0]._4_4_,s[0]._0_4_) * r[1];
              local_d0 = r[2];
              local_e0 = r[0];
              RStack_d8 = r[1];
              auVar12._8_8_ = hs;
              auVar12._0_8_ = hr;
              auVar13 = divpd(_DAT_0020f770,auVar12);
              local_b8 = s[2];
              local_c8 = CONCAT44(s[0]._4_4_,s[0]._0_4_);
              uStack_c0 = CONCAT44(s[1]._4_4_,s[1]._0_4_);
              local_f8 = divpd(auVar13,auVar12);
              local_e8 = (1.0 / local_170) / local_170;
              local_b0 = local_118;
              dStack_a8 = dStack_110;
              local_a0 = local_108;
              uVar4 = ref_matrix_form_m((REF_DBL *)local_f8,curvature_metric);
              if (uVar4 != 0) {
                pcVar9 = "reform m";
                uVar6 = 0x59c;
                goto LAB_001c3a09;
              }
              pRVar1 = local_178 + local_198 * 6;
              previous_metric[0] = *pRVar1;
              previous_metric[1] = pRVar1[1];
              previous_metric._16_16_ = *(undefined1 (*) [16])(pRVar1 + 2);
              previous_metric[4] = pRVar1[4];
              previous_metric[5] = pRVar1[5];
              uVar4 = ref_matrix_intersect(previous_metric,curvature_metric,pRVar1);
              if (uVar4 != 0) {
                pcVar9 = "intersect to update metric";
                uVar6 = 0x5a0;
                goto LAB_001c3a09;
              }
            }
          }
LAB_001c32a1:
          lVar7 = lVar7 + 1;
          lVar11 = lVar11 + 0x18;
        } while (lVar7 < ref_geom->max);
        if (0 < ref_geom->max) {
          lVar11 = 0;
          lVar7 = 0;
          do {
            if ((*(int *)((long)ref_geom->descr + lVar11) == 1) &&
               (local_198 = (long)*(int *)((long)ref_geom->descr + lVar11 + 0x14),
               ref_node->ref_mpi->id == ref_node->part[local_198])) {
              RVar10 = (REF_INT)lVar7;
              uVar4 = ref_geom_radian_request(ref_geom,RVar10,&delta_radian);
              if (uVar4 != 0) {
                pcVar9 = "drad";
                uVar6 = 0x5a7;
                goto LAB_001c3a09;
              }
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) goto LAB_001c3667;
                local_188 = hmax / delta_radian;
                uVar4 = ref_meshlink_edge_curvature(local_1a8,RVar10,&local_1a0,r);
                if (uVar4 != 0) {
                  pcVar9 = "curve";
                  uVar6 = 0x5ac;
                  goto LAB_001c3a09;
                }
              }
              else {
                local_188 = hmax / delta_radian;
                uVar4 = ref_egads_edge_curvature(ref_geom,RVar10,&local_1a0,r);
                if (uVar4 != 0) {
                  pcVar9 = "curve";
                  uVar6 = 0x5aa;
                  goto LAB_001c3a09;
                }
              }
              if (local_1a0 <= -local_1a0) {
                local_1a0 = -local_1a0;
              }
              hr = hmax;
              if (1.0 / local_188 < local_1a0) {
                hr = delta_radian / local_1a0;
              }
              if (ref_geom->model == (void *)0x0) {
                if (ref_geom->meshlink == (void *)0x0) {
                  slop = hmax * 1e-05;
                }
                else {
                  uVar4 = ref_meshlink_gap(local_1a8,(REF_INT)local_198,&slop);
                  if (uVar4 != 0) {
                    pcVar9 = "edge tol";
                    uVar6 = 0x5b8;
                    goto LAB_001c3a09;
                  }
                  slop = ref_geom->gap_protection * slop;
                }
              }
              else {
                uVar4 = ref_geom_reliability(ref_geom,RVar10,&slop);
                if (uVar4 != 0) {
                  pcVar9 = "edge tol";
                  uVar6 = 0x5b6;
                  goto LAB_001c3a09;
                }
              }
              if (slop <= hr) {
                if (ref_geom->model != (void *)0x0) {
                  uVar4 = ref_geom_crease(local_1a8,(REF_INT)local_198,&crease_dot_prod);
                  if (uVar4 != 0) {
                    pcVar9 = "crease";
                    uVar6 = 0x5c0;
                    goto LAB_001c3a09;
                  }
                  if ((double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_) < -0.8) {
                    dVar14 = (-0.8 - (double)CONCAT44(crease_dot_prod._4_4_,crease_dot_prod._0_4_))
                             / 0.2;
                    hr = hr * (dVar14 * 0.25 + (1.0 - dVar14));
                  }
                }
                local_e0 = 1.0;
                local_e8 = (1.0 / hr) / hr;
                RStack_d8 = 0.0;
                local_d0 = 0.0;
                local_c8 = 0;
                uStack_c0 = 0x3ff0000000000000;
                local_b8 = 0.0;
                local_f8._8_8_ = local_e8;
                local_f8._0_8_ = local_e8;
                local_b0 = 0.0;
                dStack_a8 = 0.0;
                local_a0 = 1.0;
                uVar4 = ref_matrix_form_m((REF_DBL *)local_f8,curvature_metric);
                if (uVar4 != 0) {
                  pcVar9 = "reform m";
                  uVar6 = 0x5d8;
                  goto LAB_001c3a09;
                }
                pRVar1 = local_178 + local_198 * 6;
                previous_metric[0] = *pRVar1;
                previous_metric[1] = pRVar1[1];
                previous_metric._16_16_ = *(undefined1 (*) [16])(pRVar1 + 2);
                previous_metric[4] = pRVar1[4];
                previous_metric[5] = pRVar1[5];
                uVar4 = ref_matrix_intersect(previous_metric,curvature_metric,pRVar1);
                if (uVar4 != 0) {
                  pcVar9 = "intersect to update metric";
                  uVar6 = 0x5dc;
                  goto LAB_001c3a09;
                }
              }
            }
LAB_001c3667:
            lVar7 = lVar7 + 1;
            lVar11 = lVar11 + 0x18;
          } while (lVar7 < ref_geom->max);
        }
      }
      pRVar1 = local_178;
      if ((local_1a8->twod != 0) && (iVar5 = ref_node->max, 0 < iVar5)) {
        lVar7 = 0;
        m = local_178;
        do {
          if ((-1 < ref_node->global[lVar7]) && (ref_node->ref_mpi->id == ref_node->part[lVar7])) {
            uVar4 = ref_matrix_twod_m(m);
            if (uVar4 != 0) {
              pcVar9 = "enforce twod";
              uVar6 = 0x5e3;
              goto LAB_001c3a09;
            }
            iVar5 = ref_node->max;
          }
          lVar7 = lVar7 + 1;
          m = m + 6;
        } while (lVar7 < iVar5);
      }
      uVar4 = ref_node_ghost_dbl(ref_node,pRVar1,6);
      if (uVar4 == 0) {
        return 0;
      }
      pcVar9 = "update ghosts";
      uVar6 = 0x5e8;
    }
    else {
      pcVar9 = "egads bbox diag";
      uVar6 = 0x536;
    }
  }
LAB_001c3a09:
  uVar8 = (ulong)uVar4;
LAB_001c3a0c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
         "ref_metric_from_curvature",uVar8,pcVar9);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_metric_from_curvature(REF_DBL *metric,
                                             REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_INT geom, node, face;
  REF_DBL kr, r[3], ks, s[3], n[3];
  REF_DBL diagonal_system[12];
  REF_DBL previous_metric[6], curvature_metric[6];
  REF_INT i;
  REF_DBL delta_radian; /* 1/segments per radian */
  REF_DBL hmax = REF_DBL_MAX;
  REF_DBL rlimit;
  REF_DBL hr, hs, hn, slop;
  REF_DBL aspect_ratio, curvature_ratio, norm_ratio;
  REF_DBL crease_dot_prod, ramp, scale;

  if (ref_geom_model_loaded(ref_geom)) {
    RSS(ref_egads_diagonal(ref_geom, REF_EMPTY, &hmax), "egads bbox diag");
  } else if (ref_geom_meshlinked(ref_geom)) {
    RSS(ref_node_bounding_box_diagonal(ref_node, &hmax), "bbox diag");
  } else {
    printf("\nNo geometry model, did you forget to load it?\n\n");
    RSS(REF_IMPLEMENT, "...or implement non-CAD curvature estimate");
  }
  /* normal spacing and max tangential spacing */
  hmax /= MAX(1.0, ref_geom_segments_per_bounding_box_diagonal(ref_geom));

  /* limit aspect ratio via curvature */
  aspect_ratio = 20.0;
  curvature_ratio = 1.0 / aspect_ratio;

  /* limit normal direction to a factor of surface spacing */
  norm_ratio = 2.0;

  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_feature_size(ref_grid, node, &hr, r, &hs, s, &hn, n),
            "feature size");
        hs = MIN(hs, hr * aspect_ratio);
        hn = MIN(hn, norm_ratio * hr);
        hn = MIN(hn, norm_ratio * hs);
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
        ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
        ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
        for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
        ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
        RSS(ref_matrix_form_m(diagonal_system, &(metric[6 * node])), "form m");
      } else {
        metric[0 + 6 * node] = 1.0 / hmax / hmax;
        metric[1 + 6 * node] = 0.0;
        metric[2 + 6 * node] = 0.0;
        metric[3 + 6 * node] = 1.0 / hmax / hmax;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0 / hmax / hmax;
      }
    }
  }

  each_ref_geom_face(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      face = ref_geom_id(ref_geom, geom) - 1;
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RXS(ref_egads_face_curvature(ref_geom, geom, &kr, r, &ks, s),
            REF_FAILURE, "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_face_curvature(ref_grid, geom, &kr, r, &ks, s),
            "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      ks = ABS(ks);
      /* limit the aspect ratio of the metric by reducing the largest radius */
      kr = MAX(kr, curvature_ratio * ks);
      ks = MAX(ks, curvature_ratio * kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;
      hs = hmax;
      if (1.0 / rlimit < ks) hs = delta_radian / ks;

      if (ref_geom_model_loaded(ref_geom)) {
        REF_BOOL usable;
        RSS(ref_geom_usable(ref_geom, geom, &usable), "useable curvature");
        if (!usable) continue;
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop || hs < slop) continue;
      if (0.0 < ref_geom_face_min_length(ref_geom, face)) {
        if (hr < ref_geom_face_min_length(ref_geom, face) ||
            hs < ref_geom_face_min_length(ref_geom, face))
          continue;
      }

      hn = hmax;
      if (0.0 < ref_geom_face_initial_cell_height(ref_geom, face))
        hn = ref_geom_face_initial_cell_height(ref_geom, face);
      hn = MIN(hn, norm_ratio * hr);
      hn = MIN(hn, norm_ratio * hs);

      /* cross the tangent vectors to get the (inward or outward) normal */
      ref_math_cross_product(r, s, n);
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 0) = r[i];
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 1) = s[i];
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hs / hs;
      for (i = 0; i < 3; i++) ref_matrix_vec(diagonal_system, i, 2) = n[i];
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hn / hn;
      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  each_ref_geom_edge(ref_geom, geom) {
    node = ref_geom_node(ref_geom, geom);
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_geom_radian_request(ref_geom, geom, &delta_radian), "drad");
      rlimit = hmax / delta_radian; /* h = r*drad, r = h/drad */
      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_egads_edge_curvature(ref_geom, geom, &kr, r), "curve");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_edge_curvature(ref_grid, geom, &kr, r), "curve");
      } else {
        continue;
      }
      /* ignore sign, curvature is 1 / radius */
      kr = ABS(kr);
      hr = hmax;
      if (1.0 / rlimit < kr) hr = delta_radian / kr;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_reliability(ref_geom, geom, &slop), "edge tol");
      } else if (ref_geom_meshlinked(ref_geom)) {
        RSS(ref_meshlink_gap(ref_grid, node, &slop), "edge tol");
        slop *= ref_geom_gap_protection(ref_geom);
      } else {
        slop = 1.0e-5 * hmax;
      }
      if (hr < slop) continue;

      if (ref_geom_model_loaded(ref_geom)) {
        RSS(ref_geom_crease(ref_grid, node, &crease_dot_prod), "crease");
        if (crease_dot_prod < -0.8) {
          ramp = (-crease_dot_prod - 0.8) / 0.2;
          scale = 0.25 * ramp + 1.0 * (1.0 - ramp);
          hr *= scale;
        }
      }

      ref_matrix_vec(diagonal_system, 0, 0) = 1.0;
      ref_matrix_vec(diagonal_system, 1, 0) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 0) = 0.0;
      ref_matrix_eig(diagonal_system, 0) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 1) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 1) = 1.0;
      ref_matrix_vec(diagonal_system, 2, 1) = 0.0;
      ref_matrix_eig(diagonal_system, 1) = 1.0 / hr / hr;

      ref_matrix_vec(diagonal_system, 0, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 1, 2) = 0.0;
      ref_matrix_vec(diagonal_system, 2, 2) = 1.0;
      ref_matrix_eig(diagonal_system, 2) = 1.0 / hr / hr;

      /* form and intersect with previous */
      RSS(ref_matrix_form_m(diagonal_system, curvature_metric), "reform m");
      for (i = 0; i < 6; i++) previous_metric[i] = metric[i + 6 * node];
      RSS(ref_matrix_intersect(previous_metric, curvature_metric,
                               &(metric[6 * node])),
          "intersect to update metric");
    }
  }

  if (ref_grid_twod(ref_grid)) {
    each_ref_node_valid_node(ref_node, node) {
      if (ref_node_owned(ref_node, node)) {
        RSS(ref_matrix_twod_m(&(metric[6 * node])), "enforce twod");
      }
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "update ghosts");

  return REF_SUCCESS;
}